

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::Program::Program(Program *this,RegexFlags flags)

{
  (this->source).ptr = (char16_t *)0x0;
  this->sourceLen = 0;
  this->numGroups = 0;
  this->numLoops = 0;
  this->flags = flags;
  this->tag = InstructionsTag;
  (this->rep).insts.insts.ptr = (uchar *)0x0;
  *(undefined8 *)((long)&this->rep + 8) = 0;
  (this->rep).insts.litbuf.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&this->rep + 0x18) = 0;
  return;
}

Assistant:

Program::Program(RegexFlags flags)
        : source(nullptr)
        , sourceLen(0)
        , flags(flags)
        , numGroups(0)
        , numLoops(0)
    {
        tag = ProgramTag::InstructionsTag;
        rep.insts.insts = nullptr;
        rep.insts.instsLen = 0;
        rep.insts.litbuf = nullptr;
        rep.insts.litbufLen = 0;
        rep.insts.scannersForSyncToLiterals = nullptr;
    }